

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenType
TypeBuilderGetTempTupleType(TypeBuilderRef builder,BinaryenType *types,BinaryenIndex numTypes)

{
  Type TVar1;
  ulong uVar2;
  undefined1 local_58 [8];
  TypeList typeList;
  long local_30;
  
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58,(ulong)numTypes,
             (allocator_type *)
             &typeList.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (numTypes != 0) {
    uVar2 = 0;
    do {
      ((pointer)((long)local_58 + uVar2 * 8))->id = types[uVar2];
      uVar2 = uVar2 + 1;
    } while (numTypes != uVar2);
  }
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
             &typeList.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_58);
  TVar1 = wasm::TypeBuilder::getTempTupleType
                    (builder,(Tuple *)&typeList.
                                       super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (typeList.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(typeList.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    local_30 -
                    (long)typeList.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (local_58 != (undefined1  [8])0x0) {
    operator_delete((void *)local_58,
                    (long)typeList.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_58);
  }
  return TVar1.id;
}

Assistant:

BinaryenType TypeBuilderGetTempTupleType(TypeBuilderRef builder,
                                         BinaryenType* types,
                                         BinaryenIndex numTypes) {
  TypeList typeList(numTypes);
  for (BinaryenIndex cur = 0; cur < numTypes; ++cur) {
    typeList[cur] = Type(types[cur]);
  }
  return ((TypeBuilder*)builder)->getTempTupleType(Tuple(typeList)).getID();
}